

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackSTGZGenerator.cxx
# Opt level: O2

void __thiscall cmCPackSTGZGenerator::cmCPackSTGZGenerator(cmCPackSTGZGenerator *this)

{
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"paxr",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,".sh",&local_4a);
  cmCPackArchiveGenerator::cmCPackArchiveGenerator
            (&this->super_cmCPackArchiveGenerator,CompressGZip,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  (this->super_cmCPackArchiveGenerator).super_cmCPackGenerator._vptr_cmCPackGenerator =
       (_func_int **)&PTR_GetNameOfClass_007cdc10;
  return;
}

Assistant:

cmCPackSTGZGenerator::cmCPackSTGZGenerator()
  : cmCPackArchiveGenerator(cmArchiveWrite::CompressGZip, "paxr", ".sh")
{
}